

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::reset
          (basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          binary_stream_sink *sink)

{
  binary_stream_sink::operator=(&this->sink_,sink);
  reset(this);
  return;
}

Assistant:

void reset(Sink&& sink)
    {
        sink_ = std::move(sink);
        reset();
    }